

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

void ConvertPopulationCountTableToBitEstimates
               (int num_symbols,uint32_t *population_counts,double *output)

{
  void *in_RDX;
  long in_RSI;
  int in_EDI;
  float fVar1;
  float fVar2;
  double logsum;
  int i;
  int nonzeros;
  uint32_t sum;
  undefined4 local_24;
  undefined4 local_20;
  
  local_20 = 0;
  for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
    if (*(int *)(in_RSI + (long)local_24 * 4) != 0) {
      local_20 = local_20 + 1;
    }
  }
  if (local_20 < 2) {
    memset(in_RDX,0,(long)in_EDI << 3);
  }
  else {
    fVar1 = VP8LFastLog2(0);
    for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
      fVar2 = VP8LFastLog2(0);
      *(double *)((long)in_RDX + (long)local_24 * 8) = (double)fVar1 - (double)fVar2;
    }
  }
  return;
}

Assistant:

static void ConvertPopulationCountTableToBitEstimates(
    int num_symbols, const uint32_t population_counts[], double output[]) {
  uint32_t sum = 0;
  int nonzeros = 0;
  int i;
  for (i = 0; i < num_symbols; ++i) {
    sum += population_counts[i];
    if (population_counts[i] > 0) {
      ++nonzeros;
    }
  }
  if (nonzeros <= 1) {
    memset(output, 0, num_symbols * sizeof(*output));
  } else {
    const double logsum = VP8LFastLog2(sum);
    for (i = 0; i < num_symbols; ++i) {
      output[i] = logsum - VP8LFastLog2(population_counts[i]);
    }
  }
}